

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.c
# Opt level: O1

void color_esycc_to_rgb(opj_image_t *image)

{
  byte bVar1;
  opj_image_comp_t *poVar2;
  OPJ_INT32 *pOVar3;
  OPJ_INT32 *pOVar4;
  OPJ_INT32 *pOVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  poVar2 = image->comps;
  bVar1 = (byte)poVar2->prec;
  iVar6 = 1 << (bVar1 - 1 & 0x1f);
  if ((((image->numcomps < 3) || (poVar2->dx != poVar2[1].dx)) || (poVar2->dx != poVar2[2].dx)) ||
     ((poVar2->dy != poVar2[1].dy || (poVar2->dy != poVar2[2].dy)))) {
    color_esycc_to_rgb_cold_1();
  }
  else {
    uVar7 = poVar2->h * poVar2->w;
    if (uVar7 != 0) {
      uVar12 = ~(-1 << (bVar1 & 0x1f));
      pOVar3 = poVar2->data;
      pOVar4 = poVar2[1].data;
      pOVar5 = poVar2[2].data;
      uVar13 = 0;
      iVar14 = 0;
      if (poVar2[1].sgnd == 0) {
        iVar14 = iVar6;
      }
      if (poVar2[2].sgnd != 0) {
        iVar6 = 0;
      }
      do {
        fVar15 = (float)pOVar3[uVar13];
        fVar17 = (float)(pOVar4[uVar13] - iVar14);
        fVar16 = (float)(pOVar5[uVar13] - iVar6);
        uVar9 = (uint)(fVar16 * 1.40199 + fVar17 * -3.68e-05 + fVar15 + 0.5);
        uVar8 = 0;
        if (0 < (int)uVar9) {
          uVar8 = uVar9;
        }
        if ((int)uVar12 < (int)uVar9) {
          uVar8 = uVar12;
        }
        uVar10 = (uint)(fVar16 * -0.7141128 + fVar15 * 1.0003 + fVar17 * -0.344125 + 0.5);
        uVar9 = 0;
        if (0 < (int)uVar10) {
          uVar9 = uVar10;
        }
        if ((int)uVar12 < (int)uVar10) {
          uVar9 = uVar12;
        }
        uVar11 = (uint)(fVar16 * -8e-06 + fVar15 * 0.999823 + fVar17 * 1.77204 + 0.5);
        uVar10 = 0;
        if (0 < (int)uVar11) {
          uVar10 = uVar11;
        }
        pOVar3[uVar13] = uVar8;
        if ((int)uVar12 < (int)uVar11) {
          uVar10 = uVar12;
        }
        pOVar4[uVar13] = uVar9;
        pOVar5[uVar13] = uVar10;
        uVar13 = uVar13 + 1;
      } while (uVar7 != uVar13);
    }
    image->color_space = OPJ_CLRSPC_SRGB;
  }
  return;
}

Assistant:

void color_esycc_to_rgb(opj_image_t *image)
{
	int y, cb, cr, sign1, sign2, val;
	unsigned int w, h, max, i;
	int flip_value = (1 << (image->comps[0].prec-1));
	int max_value = (1 << image->comps[0].prec) - 1;
	
	if (
		    (image->numcomps < 3)
		 || (image->comps[0].dx != image->comps[1].dx) || (image->comps[0].dx != image->comps[2].dx)
		 || (image->comps[0].dy != image->comps[1].dy) || (image->comps[0].dy != image->comps[2].dy)
	   ) {
		fprintf(stderr,"%s:%d:color_esycc_to_rgb\n\tCAN NOT CONVERT\n", __FILE__,__LINE__);
		return;
	}
	
	w = image->comps[0].w;
	h = image->comps[0].h;
	
	sign1 = (int)image->comps[1].sgnd;
	sign2 = (int)image->comps[2].sgnd;
	
	max = w * h;
	
	for(i = 0; i < max; ++i)
	{
		
		y = image->comps[0].data[i]; cb = image->comps[1].data[i]; cr = image->comps[2].data[i];
		
		if( !sign1) cb -= flip_value;
		if( !sign2) cr -= flip_value;
		
		val = (int)
		((float)y - (float)0.0000368 * (float)cb
		 + (float)1.40199 * (float)cr + (float)0.5);
		
		if(val > max_value) val = max_value; else if(val < 0) val = 0;
		image->comps[0].data[i] = val;
		
		val = (int)
		((float)1.0003 * (float)y - (float)0.344125 * (float)cb
		 - (float)0.7141128 * (float)cr + (float)0.5);
		
		if(val > max_value) val = max_value; else if(val < 0) val = 0;
		image->comps[1].data[i] = val;
		
		val = (int)
		((float)0.999823 * (float)y + (float)1.77204 * (float)cb
		 - (float)0.000008 *(float)cr + (float)0.5);
		
		if(val > max_value) val = max_value; else if(val < 0) val = 0;
		image->comps[2].data[i] = val;
	}
	image->color_space = OPJ_CLRSPC_SRGB;

}